

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestSubcase.cpp
# Opt level: O3

void __thiscall deqp::SubcaseBase::SubcaseBase(SubcaseBase *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*deqp::(anonymous_namespace)::current_context->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&(this->super_GLWrapper).super_CallLogWrapper,(Functions *)CONCAT44(extraout_var,iVar1)
             ,deqp::(anonymous_namespace)::current_context->m_testCtx->m_log);
  (this->super_GLWrapper).m_context = deqp::(anonymous_namespace)::current_context;
  (this->super_GLWrapper)._vptr_GLWrapper = (_func_int **)&PTR__SubcaseBase_02118160;
  return;
}

Assistant:

SubcaseBase::SubcaseBase()
{
}